

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

bool __thiscall
QGraphicsViewPrivate::updateRegion(QGraphicsViewPrivate *this,QRectF *rect,QTransform *xform)

{
  QWidgetData *pQVar1;
  bool bVar2;
  bool bVar3;
  QRect QVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  bool bVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  long in_FS_OFFSET;
  bool bVar11;
  bool bVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  QRegion region;
  QRegion local_68;
  QRegion local_60;
  undefined1 local_58 [8];
  undefined8 uStack_50;
  long local_38;
  
  QVar4._8_8_ = uStack_50;
  QVar4._0_8_ = local_58;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar7 = false;
  if ((0.0 < rect->w) && (bVar7 = false, _local_58 = QVar4, 0.0 < rect->h)) {
    if (this->viewportUpdateMode - MinimalViewportUpdate < 2) {
      local_60.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      _local_58 = (QRect)QRectF::toAlignedRect();
      QRegion::QRegion(&local_68,(QRect *)local_58,Rectangle);
      QTransform::map(&local_60);
      QRegion::~QRegion(&local_68);
      auVar14 = QRegion::boundingRect();
      uVar10 = (this->optimizationFlags).
               super_QFlagsStorageHelper<QGraphicsView::OptimizationFlag,_4>.
               super_QFlagsStorage<QGraphicsView::OptimizationFlag>.i;
      uVar9 = uVar10 & 2;
      lVar8 = 0x200000000;
      if (uVar9 != 0) {
        lVar8 = 0x100000000;
      }
      pQVar1 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
      bVar2 = (int)((-(uint)(uVar9 != 0) | 0xfffffffe) + auVar14._0_4_) <=
              ((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1;
      bVar11 = -1 < (int)((uint)(uVar9 == 0) + auVar14._8_4_ + 1);
      bVar3 = (int)((((ulong)(uVar10 >> 1) | 0xfffffffffffffffe) << 0x20) + auVar14._0_8_ >> 0x20) <
              ((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1;
      bVar12 = -1 < lVar8 + auVar14._8_8_;
      bVar7 = (bVar12 && bVar2) && (bVar3 && bVar11);
      if ((bVar12 && bVar2) && (bVar3 && bVar11)) {
        puVar5 = (undefined8 *)QRegion::begin();
        puVar6 = (undefined8 *)QRegion::end();
        uVar10 = (uint)((uVar10 & 2) == 0);
        uVar9 = (int)(uVar10 << 0x1f) >> 0x1f;
        uVar13 = (int)(uVar10 << 0x1f) >> 0x1f;
        uVar10 = uVar9 & 0xfffffffe | ~uVar9;
        uVar9 = uVar13 & 2 | ~uVar13 & 1;
        for (; puVar5 != puVar6; puVar5 = puVar5 + 2) {
          local_58._0_4_ = (undefined4)*puVar5;
          local_58._4_4_ = (undefined4)((ulong)*puVar5 >> 0x20);
          uStack_50._0_4_ = (int)puVar5[1];
          uStack_50._4_4_ = (int)((ulong)puVar5[1] >> 0x20);
          local_58._4_4_ = local_58._4_4_ + uVar10;
          local_58._0_4_ = local_58._0_4_ + uVar10;
          uStack_50 = (qreal)CONCAT44(uStack_50._4_4_ + uVar9,uStack_50._0_4_ + uVar9);
          if ((this->field_0x301 & 0x20) != 0) {
            QRect::operator&=((QRect *)local_58,&this->updateClip);
          }
          QRegion::operator+=(&this->dirtyRegion,(QRect *)local_58);
        }
      }
      QRegion::~QRegion(&local_60);
    }
    else {
      QTransform::mapRect((QRectF *)local_58);
      bVar7 = updateRectF(this,(QRectF *)local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsViewPrivate::updateRegion(const QRectF &rect, const QTransform &xform)
{
    if (rect.isEmpty())
        return false;

    if (viewportUpdateMode != QGraphicsView::MinimalViewportUpdate
        && viewportUpdateMode != QGraphicsView::SmartViewportUpdate) {
        // No point in updating with QRegion granularity; use the rect instead.
        return updateRectF(xform.mapRect(rect));
    }

    // Update mode is either Minimal or Smart, so we have to do a potentially slow operation,
    // which is clearly documented here: QGraphicsItem::setBoundingRegionGranularity.
    const QRegion region = xform.map(QRegion(rect.toAlignedRect()));
    QRect viewRect = region.boundingRect();
    const bool dontAdjustForAntialiasing = optimizationFlags & QGraphicsView::DontAdjustForAntialiasing;
    if (dontAdjustForAntialiasing)
        viewRect.adjust(-1, -1, 1, 1);
    else
        viewRect.adjust(-2, -2, 2, 2);
    if (!intersectsViewport(viewRect, viewport->width(), viewport->height()))
        return false; // Update region for sure outside viewport.

    for (QRect viewRect : region) {
        if (dontAdjustForAntialiasing)
            viewRect.adjust(-1, -1, 1, 1);
        else
            viewRect.adjust(-2, -2, 2, 2);
        if (hasUpdateClip)
            viewRect &= updateClip;
        dirtyRegion += viewRect;
    }

    return true;
}